

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O3

int ldesdecode(lua_State *L)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  char *s;
  uint32_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  size_t textsz;
  uint32_t SK [32];
  uint32_t ESK [32];
  uint8_t tmp [256];
  size_t local_240;
  uint32_t local_238 [32];
  uint32_t local_1b8 [32];
  char local_138 [264];
  
  des_key(L,local_1b8);
  lVar4 = 0xe;
  puVar6 = local_238;
  do {
    uVar1 = local_1b8[lVar4 * 2];
    uVar2 = local_1b8[lVar4 * 2 + 1];
    *puVar6 = local_1b8[lVar4 * 2 + 2];
    puVar6[1] = uVar2;
    puVar6[2] = uVar1;
    puVar6[3] = uVar2;
    lVar4 = lVar4 + -2;
    puVar6 = puVar6 + 4;
  } while (lVar4 != -2);
  local_240 = 0;
  pcVar5 = luaL_checklstring(L,2,&local_240);
  if (local_240 == 0 || (local_240 & 7) != 0) {
    luaL_error(L,"Invalid des crypt text length %d");
  }
  if (local_240 < 0x101) {
    s = local_138;
  }
  else {
    s = (char *)lua_newuserdata(L,local_240);
    if (local_240 == 0) {
      uVar7 = 0;
      goto LAB_0011d13e;
    }
  }
  uVar8 = 0;
  do {
    des_crypt(local_238,(uint8_t *)(pcVar5 + uVar8),(uint8_t *)(s + uVar8));
    uVar8 = uVar8 + 8;
    uVar7 = local_240;
  } while (uVar8 < local_240);
LAB_0011d13e:
  uVar8 = (ulong)((int)uVar7 + -1);
  uVar3 = 1;
  if (uVar7 - 8 <= uVar8) {
    iVar9 = (int)uVar7 + -2;
    do {
      if (s[uVar8] != '\0') {
        if (s[uVar8] != -0x80) goto LAB_0011d17f;
        break;
      }
      uVar3 = uVar3 + 1;
      uVar8 = (ulong)iVar9;
      iVar9 = iVar9 + -1;
    } while (uVar7 - 8 <= uVar8);
    if (8 < uVar3) {
LAB_0011d17f:
      luaL_error(L,"Invalid des crypt text");
    }
  }
  lua_pushlstring(L,s,uVar7 - uVar3);
  return 1;
}

Assistant:

static int
ldesdecode(lua_State *L) {
	uint32_t ESK[32];
	des_key(L, ESK);
	uint32_t SK[32];
	int i;
	for( i = 0; i < 32; i += 2 ) {
		SK[i] = ESK[30 - i];
		SK[i + 1] = ESK[31 - i];
	}
	size_t textsz = 0;
	const uint8_t *text = (const uint8_t *)luaL_checklstring(L, 2, &textsz);
	if ((textsz & 7) || textsz == 0) {
		return luaL_error(L, "Invalid des crypt text length %d", (int)textsz);
	}
	uint8_t tmp[SMALL_CHUNK];
	uint8_t *buffer = tmp;
	if (textsz > SMALL_CHUNK) {
		buffer = lua_newuserdata(L, textsz);
	}
	for (i=0;i<textsz;i+=8) {
		des_crypt(SK, text+i, buffer+i);
	}
	int padding = 1;
	for (i=textsz-1;i>=textsz-8;i--) {
		if (buffer[i] == 0) {
			padding++;
		} else if (buffer[i] == 0x80) {
			break;
		} else {
			return luaL_error(L, "Invalid des crypt text");
		}
	}
	if (padding > 8) {
		return luaL_error(L, "Invalid des crypt text");
	}
	lua_pushlstring(L, (const char *)buffer, textsz - padding);
	return 1;
}